

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_cookie.c
# Opt level: O3

int ssl_cookie_hmac(mbedtls_md_context_t *hmac_ctx,uchar *time,uchar **p,uchar *end,uchar *cli_id,
                   size_t cli_id_len)

{
  uchar *puVar1;
  int iVar2;
  int iVar3;
  undefined8 uStack_58;
  uchar hmac_out [32];
  
  iVar3 = -0x6a00;
  if (0x1b < (ulong)((long)end - (long)*p) && *p <= end) {
    hmac_out._24_8_ = cli_id_len;
    iVar2 = mbedtls_md_hmac_reset(hmac_ctx);
    iVar3 = -0x6c00;
    if (iVar2 == 0) {
      iVar2 = mbedtls_md_hmac_update(hmac_ctx,time,4);
      if (iVar2 == 0) {
        iVar2 = mbedtls_md_hmac_update(hmac_ctx,cli_id,hmac_out._24_8_);
        if (iVar2 == 0) {
          iVar2 = mbedtls_md_hmac_finish(hmac_ctx,(uchar *)&uStack_58);
          if (iVar2 == 0) {
            puVar1 = *p;
            *(ulong *)(puVar1 + 0xc) = CONCAT44(hmac_out._8_4_,hmac_out._4_4_);
            *(undefined8 *)(puVar1 + 0x14) = hmac_out._12_8_;
            *(undefined8 *)puVar1 = uStack_58;
            *(ulong *)(puVar1 + 8) = CONCAT44(hmac_out._4_4_,hmac_out._0_4_);
            *p = *p + 0x1c;
            iVar3 = 0;
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

MBEDTLS_CHECK_RETURN_CRITICAL
static int ssl_cookie_hmac(mbedtls_md_context_t *hmac_ctx,
                           const unsigned char time[4],
                           unsigned char **p, unsigned char *end,
                           const unsigned char *cli_id, size_t cli_id_len)
{
    unsigned char hmac_out[COOKIE_MD_OUTLEN];

    MBEDTLS_SSL_CHK_BUF_PTR(*p, end, COOKIE_HMAC_LEN);

    if (mbedtls_md_hmac_reset(hmac_ctx) != 0 ||
        mbedtls_md_hmac_update(hmac_ctx, time, 4) != 0 ||
        mbedtls_md_hmac_update(hmac_ctx, cli_id, cli_id_len) != 0 ||
        mbedtls_md_hmac_finish(hmac_ctx, hmac_out) != 0) {
        return MBEDTLS_ERR_SSL_INTERNAL_ERROR;
    }

    memcpy(*p, hmac_out, COOKIE_HMAC_LEN);
    *p += COOKIE_HMAC_LEN;

    return 0;
}